

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v7::detail::
       parse_arg_id<char,fmt::v7::detail::width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&,char>>
                 (char *begin,char *end,
                 width_adapter<fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>_&,_char>
                 *handler)

{
  byte bVar1;
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> *pbVar2;
  basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *pbVar3;
  int iVar4;
  uint id;
  byte *pbVar5;
  byte *pbVar6;
  byte *pbVar7;
  format_arg *__return_storage_ptr__;
  specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
  *psVar8;
  basic_string_view<char> name;
  format_arg arg;
  format_arg local_48;
  
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    psVar8 = handler->handler;
    pbVar2 = (psVar8->
             super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
             ).parse_context_;
    id = pbVar2->next_arg_id_;
    if ((int)id < 0) {
      error_handler::on_error
                ((error_handler *)begin,"cannot switch from manual to automatic argument indexing");
    }
    pbVar3 = (psVar8->
             super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
             ).context_;
    pbVar2->next_arg_id_ = id + 1;
    pbVar6 = (byte *)begin;
  }
  else {
    if (9 < (byte)(bVar1 - 0x30)) {
      if ((bVar1 != 0x5f) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) goto LAB_00196459;
      pbVar6 = (byte *)(begin + 1);
      do {
        pbVar5 = pbVar6;
        pbVar7 = (byte *)end;
        if (pbVar5 == (byte *)end) break;
        bVar1 = *pbVar5;
        pbVar6 = pbVar5 + 1;
      } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
              (pbVar7 = pbVar5, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
      name.size_ = (long)pbVar7 - (long)begin;
      psVar8 = handler->handler;
      __return_storage_ptr__ = &local_48;
      name.data_ = begin;
      basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
      ::get<char>(__return_storage_ptr__,
                  &((psVar8->
                    super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                    ).context_)->args_,name);
      if (local_48.type_ != none_type) {
        iVar4 = get_dynamic_spec<fmt::v7::detail::width_checker,fmt::v7::basic_format_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>,fmt::v7::detail::error_handler>
                          ();
        ((psVar8->
         super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
         ).super_specs_setter<char>.specs_)->width = iVar4;
        return (char *)pbVar7;
      }
      goto LAB_00196441;
    }
    pbVar6 = (byte *)(begin + 1);
    id = 0;
    pbVar7 = pbVar6;
    if (bVar1 != 0x30) {
      do {
        if (0xccccccc < id) goto LAB_00196435;
        id = ((uint)bVar1 + id * 10) - 0x30;
        pbVar6 = (byte *)end;
        if (pbVar7 == (byte *)end) break;
        bVar1 = *pbVar7;
        pbVar6 = pbVar7;
        pbVar7 = pbVar7 + 1;
      } while ((byte)(bVar1 - 0x30) < 10);
      if ((int)id < 0) {
LAB_00196435:
        error_handler::on_error((error_handler *)begin,"number is too big");
      }
    }
    if ((pbVar6 == (byte *)end) || ((*pbVar6 != 0x3a && (*pbVar6 != 0x7d)))) {
LAB_00196459:
      error_handler::on_error((error_handler *)begin,"invalid format string");
    }
    psVar8 = handler->handler;
    pbVar2 = (psVar8->
             super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
             ).parse_context_;
    if (0 < pbVar2->next_arg_id_) {
      error_handler::on_error
                ((error_handler *)begin,"cannot switch from automatic to manual argument indexing");
    }
    pbVar2->next_arg_id_ = -1;
    pbVar3 = (psVar8->
             super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
             ).context_;
  }
  __return_storage_ptr__ = &local_48;
  basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
  ::get(__return_storage_ptr__,&pbVar3->args_,id);
  if (local_48.type_ != none_type) {
    iVar4 = get_dynamic_spec<fmt::v7::detail::width_checker,fmt::v7::basic_format_arg<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>,fmt::v7::detail::error_handler>
                      ();
    ((psVar8->
     super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
     ).super_specs_setter<char>.specs_)->width = iVar4;
    return (char *)pbVar6;
  }
LAB_00196441:
  error_handler::on_error((error_handler *)__return_storage_ptr__,"argument not found");
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, handler);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}